

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilut.h
# Opt level: O0

void Mini_LutPush(Mini_Lut_t *p,int nVars,int *pVars,uint *pTruth)

{
  int iVar1;
  uint local_34;
  int local_2c;
  int nWords;
  int i;
  uint *pTruth_local;
  int *pVars_local;
  int nVars_local;
  Mini_Lut_t *p_local;
  
  iVar1 = Mini_LutWordNum(p->LutSize);
  if (p->nSize == p->nCap) {
    if (0x3ffffffe < p->LutSize * p->nSize) {
      __assert_fail("p->LutSize*p->nSize < MINI_LUT_NULL/2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/minilut.h"
                    ,0x5d,"void Mini_LutPush(Mini_Lut_t *, int, int *, unsigned int *)");
    }
    if (p->nCap < 0xff) {
      Mini_LutGrow(p,0xff);
    }
    else {
      Mini_LutGrow(p,p->nCap << 1);
    }
  }
  local_2c = 0;
  while( true ) {
    if (nVars <= local_2c) {
      for (local_2c = 0; local_2c < nVars; local_2c = local_2c + 1) {
        p->pArray[p->LutSize * p->nSize + local_2c] = pVars[local_2c];
      }
      for (; local_2c < p->LutSize; local_2c = local_2c + 1) {
        p->pArray[p->LutSize * p->nSize + local_2c] = 0x7fffffff;
      }
      for (local_2c = 0; local_2c < iVar1; local_2c = local_2c + 1) {
        if (pTruth == (uint *)0x0) {
          local_34 = 0;
        }
        else {
          local_34 = pTruth[local_2c];
        }
        p->pTruths[iVar1 * p->nSize + local_2c] = local_34;
      }
      p->nSize = p->nSize + 1;
      return;
    }
    if ((pVars[local_2c] < 0) || (p->nSize <= pVars[local_2c])) break;
    local_2c = local_2c + 1;
  }
  __assert_fail("pVars[i] >= 0 && pVars[i] < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/minilut.h"
                ,100,"void Mini_LutPush(Mini_Lut_t *, int, int *, unsigned int *)");
}

Assistant:

static void Mini_LutPush( Mini_Lut_t * p, int nVars, int * pVars, unsigned * pTruth )
{
    int i, nWords = Mini_LutWordNum(p->LutSize);
    if ( p->nSize == p->nCap )
    {
        assert( p->LutSize*p->nSize < MINI_LUT_NULL/2 );
        if ( p->nCap < MINI_LUT_START_SIZE )
            Mini_LutGrow( p, MINI_LUT_START_SIZE );
        else
            Mini_LutGrow( p, 2 * p->nCap );
    }
    for ( i = 0; i < nVars; i++ )
        assert( pVars[i] >= 0 && pVars[i] < p->nSize );
    for ( i = 0; i < nVars; i++ )
        p->pArray[p->LutSize * p->nSize + i] = pVars[i];
    for ( ; i < p->LutSize; i++ )
        p->pArray[p->LutSize * p->nSize + i] = MINI_LUT_NULL;
    for ( i = 0; i < nWords; i++ )
        p->pTruths[nWords * p->nSize + i] = pTruth? pTruth[i] : 0;
    p->nSize++;
}